

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printvisitor.cpp
# Opt level: O2

void __thiscall
PrintVisitor::visit(PrintVisitor *this,Expression *parent,NumberExpression *expression)

{
  ostream *poVar1;
  NumericConstant *this_00;
  string local_30;
  
  poVar1 = this->mStream;
  this_00 = NumberExpression::value(expression);
  NumericConstant::toString_abi_cxx11_(&local_30,this_00);
  std::operator<<(poVar1,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void PrintVisitor::visit(Expression* parent, NumberExpression* expression) {
	mStream << expression->value().toString();
}